

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Return * __thiscall MixedArena::alloc<wasm::Return>(MixedArena *this)

{
  Return *pRVar1;
  
  pRVar1 = (Return *)allocSpace(this,0x18,8);
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)19>).super_Expression._id = ReturnId;
  pRVar1->value = (Expression *)0x0;
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)19>).super_Expression.type.id = 1;
  return pRVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }